

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain
          (CompilerHLSL *this,string *expr,string *lhs,SPIRAccessChain *chain)

{
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  SPIRType *pSVar4;
  long *plVar5;
  runtime_error *prVar6;
  size_type *psVar7;
  char (*in_R8) [2];
  string *in_R9;
  uint uVar8;
  uint uVar9;
  char (*pacVar10) [2];
  char *load_op_1;
  size_type local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  SPIRAccessChain *local_388;
  SPIRType *local_380;
  char *load_op;
  string load_expr;
  undefined1 *local_348 [2];
  undefined1 local_338 [20];
  uint local_324;
  string template_expr;
  string base;
  SPIRType scalar_type;
  SPIRType target_type;
  
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(chain->super_IVariant).field_0xc);
  target_type.array.super_VectorView<unsigned_int>.ptr = (uint *)&target_type.array.stack_storage;
  target_type.super_IVariant.self.id = 0;
  target_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003fd210;
  target_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  target_type.array.buffer_capacity = 8;
  target_type.array_size_literal.super_VectorView<bool>.ptr =
       (bool *)&target_type.array_size_literal.stack_storage;
  target_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  target_type.array_size_literal.buffer_capacity = 8;
  target_type.pointer_depth = 0;
  target_type.pointer = false;
  target_type.forward_pointer = false;
  target_type.storage = StorageClassGeneric;
  target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
       (TypedID<(spirv_cross::Types)1> *)&target_type.member_types.stack_storage;
  target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
  buffer_size = 0;
  target_type.member_types.buffer_capacity = 8;
  target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr =
       (uint *)&target_type.member_type_index_redirection.stack_storage;
  target_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  target_type.member_type_index_redirection.buffer_capacity = 8;
  target_type.image.type.id = 0;
  target_type.type_alias.id = 0;
  target_type.parent_type.id = 0;
  target_type.member_name_cache._M_h._M_buckets =
       &target_type.member_name_cache._M_h._M_single_bucket;
  target_type.member_name_cache._M_h._M_bucket_count = 1;
  target_type.member_name_cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  target_type.member_name_cache._M_h._M_element_count = 0;
  target_type.member_name_cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  target_type.member_name_cache._M_h._M_rehash_policy._M_next_resize = 0;
  target_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  target_type.super_IVariant._12_4_ = 8;
  target_type.width = 0;
  target_type.vecsize = pSVar4->vecsize;
  target_type.columns = pSVar4->columns;
  if ((pSVar4->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    read_access_chain_array(this,lhs,chain);
    goto LAB_0026ff9f;
  }
  local_388 = chain;
  if (*(int *)&(pSVar4->super_IVariant).field_0xc == 0xf) {
    read_access_chain_struct(this,lhs,chain);
    goto LAB_0026ff9f;
  }
  if ((pSVar4->width != 0x20) && ((this->hlsl_options).enable_16bit_types == false)) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&scalar_type.width;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&scalar_type,
               "Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
               ,"");
    ::std::runtime_error::runtime_error(prVar6,(string *)&scalar_type);
    *(undefined ***)prVar6 = &PTR__runtime_error_003fce08;
    __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  base._M_dataplus._M_p = (pointer)&base.field_2;
  pcVar2 = (chain->base)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&base,pcVar2,pcVar2 + (chain->base)._M_string_length);
  pacVar10 = (char (*) [2])0x26f366;
  bVar3 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(chain->super_IVariant).self.id,DecorationNonUniform);
  if (bVar3) {
    pacVar10 = (char (*) [2])0x26f37e;
    CompilerGLSL::convert_non_uniform_expression
              (&this->super_CompilerGLSL,&base,(chain->super_IVariant).self.id);
  }
  uVar9 = (this->hlsl_options).shader_model;
  load_expr._M_dataplus._M_p = (pointer)&load_expr.field_2;
  load_expr._M_string_length = 0;
  load_expr.field_2._M_local_buf[0] = '\0';
  template_expr._M_dataplus._M_p = (pointer)&template_expr.field_2;
  template_expr._M_string_length = 0;
  template_expr.field_2._M_local_buf[0] = '\0';
  if (0x3d < uVar9) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&load_op_1,this,pSVar4,0);
    join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              ((string *)&scalar_type,(spirv_cross *)0x3626d6,(char (*) [2])&load_op_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36cdd5,in_R8);
    pacVar10 = (char (*) [2])0x26f401;
    ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&scalar_type);
    if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
      pacVar10 = (char (*) [2])0x26f416;
      operator_delete(scalar_type.super_IVariant._vptr_IVariant);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)load_op_1 != &local_398) {
      pacVar10 = (char (*) [2])0x26f429;
      operator_delete(load_op_1);
    }
  }
  local_380 = pSVar4;
  local_324 = uVar9;
  if (pSVar4->columns == 1) {
    if (chain->row_major_matrix == false) {
      load_op_1 = (char *)0x0;
      switch(pSVar4->vecsize) {
      case 1:
        load_op_1 = "Load";
        break;
      case 2:
        load_op_1 = "Load2";
        break;
      case 3:
        load_op_1 = "Load3";
        break;
      case 4:
        load_op_1 = "Load4";
        break;
      default:
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&scalar_type.width;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&scalar_type,"Unknown vector size.","");
        ::std::runtime_error::runtime_error(prVar6,(string *)&scalar_type);
        *(undefined ***)prVar6 = &PTR__runtime_error_003fce08;
        __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (0x3d < uVar9) {
        load_op_1 = "Load";
      }
      in_R9 = (string *)0x37dfb0;
      join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[2]>
                ((string *)&scalar_type,(spirv_cross *)&base,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36612b,
                 (char (*) [2])&load_op_1,(char **)&template_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37dfb0,
                 (char (*) [2])&chain->dynamic_index,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &chain->static_index,(int *)0x36641e,pacVar10);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
        operator_delete(scalar_type.super_IVariant._vptr_IVariant);
      }
    }
    else {
      if (uVar9 < 0x3e) {
        if (1 < pSVar4->vecsize) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&scalar_type,this,&target_type,0);
          ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
          if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
            operator_delete(scalar_type.super_IVariant._vptr_IVariant);
          }
          ::std::__cxx11::string::append((char *)&load_expr);
        }
      }
      else {
        SPIRType::SPIRType(&scalar_type,pSVar4);
        scalar_type.vecsize = 1;
        scalar_type.columns = 1;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_348,this,&scalar_type,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  ((string *)&load_op_1,(spirv_cross *)0x3626d6,(char (*) [2])local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36cdd5,
                   in_R8);
        ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&load_op_1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)load_op_1 != &local_398) {
          operator_delete(load_op_1);
        }
        if (local_348[0] != local_338) {
          operator_delete(local_348[0]);
        }
        if (1 < pSVar4->vecsize) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_348,this,pSVar4,0)
          ;
          plVar5 = (long *)::std::__cxx11::string::append((char *)local_348);
          psVar7 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar7) {
            local_398._M_allocated_capacity = *psVar7;
            local_398._8_8_ = plVar5[3];
            load_op_1 = (char *)&local_398;
          }
          else {
            local_398._M_allocated_capacity = *psVar7;
            load_op_1 = (char *)*plVar5;
          }
          local_3a0 = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&load_expr,(ulong)load_op_1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)load_op_1 != &local_398) {
            operator_delete(load_op_1);
          }
          if (local_348[0] != local_338) {
            operator_delete(local_348[0]);
          }
        }
        scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003fd210;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&scalar_type.member_name_cache._M_h);
        scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)
            scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
            &scalar_type.member_type_index_redirection.stack_storage) {
          free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
        }
        scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size = 0;
        if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
            scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            ptr != &scalar_type.member_types.stack_storage) {
          free(scalar_type.member_types.
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
        }
        scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
        if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr !=
            &scalar_type.array_size_literal.stack_storage) {
          free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
        }
        scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)scalar_type.array.super_VectorView<unsigned_int>.ptr
            != &scalar_type.array.stack_storage) {
          free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
        }
      }
      if (pSVar4->vecsize != 0) {
        psVar1 = &local_388->dynamic_index;
        uVar9 = 0;
        do {
          load_op_1 = (char *)CONCAT44(load_op_1._4_4_,
                                       local_388->matrix_stride * uVar9 + local_388->static_index);
          in_R9 = psVar1;
          join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                    ((string *)&scalar_type,(spirv_cross *)&base,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                     (char (*) [6])&template_expr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37dfb0,
                     (char (*) [2])psVar1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&load_op_1
                     ,(uint *)0x36641e,(char (*) [2])load_op_1);
          ::std::__cxx11::string::_M_append
                    ((char *)&load_expr,(ulong)scalar_type.super_IVariant._vptr_IVariant);
          if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
            operator_delete(scalar_type.super_IVariant._vptr_IVariant);
          }
          uVar9 = uVar9 + 1;
          if (uVar9 < local_380->vecsize) {
            ::std::__cxx11::string::append((char *)&load_expr);
          }
        } while (uVar9 < local_380->vecsize);
        pSVar4 = local_380;
        if (1 < local_380->vecsize) goto LAB_0026f882;
      }
    }
  }
  else if (chain->row_major_matrix == false) {
    load_op = (char *)0x0;
    switch(pSVar4->vecsize) {
    case 1:
      load_op = "Load";
      break;
    case 2:
      load_op = "Load2";
      break;
    case 3:
      load_op = "Load3";
      break;
    case 4:
      load_op = "Load4";
      break;
    default:
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&scalar_type.width;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&scalar_type,"Unknown vector size.","");
      ::std::runtime_error::runtime_error(prVar6,(string *)&scalar_type);
      *(undefined ***)prVar6 = &PTR__runtime_error_003fce08;
      __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (uVar9 < 0x3e) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&scalar_type,this,&target_type,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
        operator_delete(scalar_type.super_IVariant._vptr_IVariant);
      }
    }
    else {
      SPIRType::SPIRType(&scalar_type,pSVar4);
      scalar_type.columns = 1;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_348,this,&scalar_type,0);
      join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                ((string *)&load_op_1,(spirv_cross *)0x3626d6,(char (*) [2])local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36cdd5,in_R8
                );
      ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&load_op_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)load_op_1 != &local_398) {
        operator_delete(load_op_1);
      }
      if (local_348[0] != local_338) {
        operator_delete(local_348[0]);
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&load_op_1,this,pSVar4,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&load_op_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)load_op_1 != &local_398) {
        operator_delete(load_op_1);
      }
      load_op = "Load";
      scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003fd210;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&scalar_type.member_name_cache._M_h);
      scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)
          scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
          &scalar_type.member_type_index_redirection.stack_storage) {
        free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
      }
      scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size = 0;
      if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
          scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          ptr != &scalar_type.member_types.stack_storage) {
        free(scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
             .ptr);
      }
      scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
      if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr !=
          &scalar_type.array_size_literal.stack_storage) {
        free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
      }
      scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)scalar_type.array.super_VectorView<unsigned_int>.ptr
          != &scalar_type.array.stack_storage) {
        free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
      }
    }
    pacVar10 = (char (*) [2])0x26fa75;
    ::std::__cxx11::string::append((char *)&load_expr);
    if (pSVar4->columns != 0) {
      psVar1 = &local_388->dynamic_index;
      uVar9 = 0;
      do {
        load_op_1 = (char *)CONCAT44(load_op_1._4_4_,
                                     local_388->matrix_stride * uVar9 + local_388->static_index);
        in_R9 = (string *)0x37dfb0;
        join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                  ((string *)&scalar_type,(spirv_cross *)&base,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36612b,
                   (char (*) [2])&load_op,(char **)&template_expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37dfb0,
                   (char (*) [2])psVar1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&load_op_1,
                   (uint *)0x36641e,pacVar10);
        pacVar10 = (char (*) [2])0x26fb0c;
        ::std::__cxx11::string::_M_append
                  ((char *)&load_expr,(ulong)scalar_type.super_IVariant._vptr_IVariant);
        if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
          pacVar10 = (char (*) [2])0x26fb26;
          operator_delete(scalar_type.super_IVariant._vptr_IVariant);
        }
        uVar9 = uVar9 + 1;
        if (uVar9 < local_380->columns) {
          pacVar10 = (char (*) [2])0x26fb43;
          ::std::__cxx11::string::append((char *)&load_expr);
        }
      } while (uVar9 < local_380->columns);
    }
    ::std::__cxx11::string::append((char *)&load_expr);
    pSVar4 = local_380;
  }
  else {
    if (uVar9 < 0x3e) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&scalar_type,this,&target_type,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
        operator_delete(scalar_type.super_IVariant._vptr_IVariant);
      }
    }
    else {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&scalar_type,this,pSVar4,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
        operator_delete(scalar_type.super_IVariant._vptr_IVariant);
      }
      SPIRType::SPIRType(&scalar_type,pSVar4);
      scalar_type.vecsize = 1;
      scalar_type.columns = 1;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_348,this,&scalar_type,0);
      join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                ((string *)&load_op_1,(spirv_cross *)0x3626d6,(char (*) [2])local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36cdd5,in_R8
                );
      ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&load_op_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)load_op_1 != &local_398) {
        operator_delete(load_op_1);
      }
      if (local_348[0] != local_338) {
        operator_delete(local_348[0]);
      }
      scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003fd210;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&scalar_type.member_name_cache._M_h);
      scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)
          scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
          &scalar_type.member_type_index_redirection.stack_storage) {
        free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
      }
      scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size = 0;
      if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
          scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          ptr != &scalar_type.member_types.stack_storage) {
        free(scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
             .ptr);
      }
      scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
      if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr !=
          &scalar_type.array_size_literal.stack_storage) {
        free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
      }
      scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)scalar_type.array.super_VectorView<unsigned_int>.ptr
          != &scalar_type.array.stack_storage) {
        free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
      }
    }
    ::std::__cxx11::string::append((char *)&load_expr);
    if (pSVar4->columns != 0) {
      psVar1 = &local_388->dynamic_index;
      uVar9 = 0;
      do {
        if (pSVar4->vecsize != 0) {
          uVar8 = 0;
          do {
            load_op_1 = (char *)CONCAT44(load_op_1._4_4_,
                                         local_388->matrix_stride * uVar8 +
                                         (pSVar4->width >> 3) * uVar9 + local_388->static_index);
            in_R9 = psVar1;
            join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                      ((string *)&scalar_type,(spirv_cross *)&base,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                       (char (*) [6])&template_expr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37dfb0
                       ,(char (*) [2])psVar1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &load_op_1,(uint *)0x36641e,(char (*) [2])load_op_1);
            ::std::__cxx11::string::_M_append
                      ((char *)&load_expr,(ulong)scalar_type.super_IVariant._vptr_IVariant);
            if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
              operator_delete(scalar_type.super_IVariant._vptr_IVariant);
            }
            pSVar4 = local_380;
            uVar8 = uVar8 + 1;
            if ((uVar8 < local_380->vecsize) || (uVar9 + 1 < local_380->columns)) {
              ::std::__cxx11::string::append((char *)&load_expr);
            }
          } while (uVar8 < pSVar4->vecsize);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < pSVar4->columns);
    }
LAB_0026f882:
    ::std::__cxx11::string::append((char *)&load_expr);
  }
  if (local_324 < 0x3e) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3a])
              (&scalar_type,this,pSVar4,&target_type);
    if (scalar_type.super_IVariant._8_8_ != 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                ((string *)&load_op_1,(spirv_cross *)&scalar_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37dfb0,
                 (char (*) [2])&load_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36641e,
                 (char (*) [2])in_R9);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&load_op_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)load_op_1 != &local_398) {
        operator_delete(load_op_1);
      }
    }
    if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
      operator_delete(scalar_type.super_IVariant._vptr_IVariant);
    }
  }
  if (lhs->_M_string_length == 0) {
    if (expr == (string *)0x0) {
      __assert_fail("expr",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_hlsl.cpp"
                    ,0x121e,
                    "void spirv_cross::CompilerHLSL::read_access_chain(string *, const string &, const SPIRAccessChain &)"
                   );
    }
    ::std::__cxx11::string::operator=((string *)expr,(string *)&load_expr);
  }
  else {
    CompilerGLSL::
    statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,lhs,(char (*) [4])0x37d8ee,&load_expr,
               (char (*) [2])0x365574);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)template_expr._M_dataplus._M_p != &template_expr.field_2) {
    operator_delete(template_expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)load_expr._M_dataplus._M_p != &load_expr.field_2) {
    operator_delete(load_expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base._M_dataplus._M_p != &base.field_2) {
    operator_delete(base._M_dataplus._M_p);
  }
LAB_0026ff9f:
  target_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003fd210;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&target_type.member_name_cache._M_h);
  target_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &target_type.member_type_index_redirection.stack_storage) {
    free(target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
  buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
      &target_type.member_types.stack_storage) {
    free(target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
        );
  }
  target_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)target_type.array_size_literal.super_VectorView<bool>.ptr !=
      &target_type.array_size_literal.stack_storage) {
    free(target_type.array_size_literal.super_VectorView<bool>.ptr);
  }
  target_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)target_type.array.super_VectorView<unsigned_int>.ptr !=
      &target_type.array.stack_storage) {
    free(target_type.array.super_VectorView<unsigned_int>.ptr);
  }
  return;
}

Assistant:

void CompilerHLSL::read_access_chain(string *expr, const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	SPIRType target_type;
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		read_access_chain_array(lhs, chain);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		read_access_chain_struct(lhs, chain);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	string base = chain.base;
	if (has_decoration(chain.self, DecorationNonUniform))
		convert_non_uniform_expression(base, chain.self);

	bool templated_load = hlsl_options.shader_model >= 62;
	string load_expr;

	string template_expr;
	if (templated_load)
		template_expr = join("<", type_to_glsl(type), ">");

	// Load a vector or scalar.
	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
			load_op = "Load";

		load_expr = join(base, ".", load_op, template_expr, "(", chain.dynamic_index, chain.static_index, ")");
	}
	else if (type.columns == 1)
	{
		// Strided load since we are loading a column from a row-major matrix.
		if (templated_load)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
			if (type.vecsize > 1)
				load_expr += type_to_glsl(type) + "(";
		}
		else if (type.vecsize > 1)
		{
			load_expr = type_to_glsl(target_type);
			load_expr += "(";
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
			                  chain.static_index + r * chain.matrix_stride, ")");
			if (r + 1 < type.vecsize)
				load_expr += ", ";
		}

		if (type.vecsize > 1)
			load_expr += ")";
	}
	else if (!chain.row_major_matrix)
	{
		// Load a matrix, column-major, the easy case.
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
		{
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
			load_expr = type_to_glsl(type);
			load_op = "Load";
		}
		else
		{
			// Note, this loading style in HLSL is *actually* row-major, but we always treat matrices as transposed in this backend,
			// so row-major is technically column-major ...
			load_expr = type_to_glsl(target_type);
		}
		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			load_expr += join(base, ".", load_op, template_expr, "(", chain.dynamic_index,
			                  chain.static_index + c * chain.matrix_stride, ")");
			if (c + 1 < type.columns)
				load_expr += ", ";
		}
		load_expr += ")";
	}
	else
	{
		// Pick out elements one by one ... Hopefully compilers are smart enough to recognize this pattern
		// considering HLSL is "row-major decl", but "column-major" memory layout (basically implicit transpose model, ugh) ...

		if (templated_load)
		{
			load_expr = type_to_glsl(type);
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}
		else
			load_expr = type_to_glsl(target_type);

		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			for (uint32_t r = 0; r < type.vecsize; r++)
			{
				load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
				                  chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ")");

				if ((r + 1 < type.vecsize) || (c + 1 < type.columns))
					load_expr += ", ";
			}
		}
		load_expr += ")";
	}

	if (!templated_load)
	{
		auto bitcast_op = bitcast_glsl_op(type, target_type);
		if (!bitcast_op.empty())
			load_expr = join(bitcast_op, "(", load_expr, ")");
	}

	if (lhs.empty())
	{
		assert(expr);
		*expr = std::move(load_expr);
	}
	else
		statement(lhs, " = ", load_expr, ";");
}